

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.cpp
# Opt level: O3

void __thiscall rsg::GeneratorState::~GeneratorState(GeneratorState *this)

{
  pointer piVar1;
  pointer puVar2;
  
  piVar1 = (this->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_precedenceStack).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  puVar2 = (this->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_exprFlagStack).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  NameAllocator::~NameAllocator(&this->m_nameAllocator);
  return;
}

Assistant:

GeneratorState::~GeneratorState (void)
{
}